

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::TextGenerator::WriteIndent(TextGenerator *this)

{
  byte bVar1;
  long *in_RDI;
  void *void_buffer;
  int size;
  long local_68;
  int local_5c;
  
  if ((int)in_RDI[4] != 0) {
    local_5c = (**(code **)(*in_RDI + 0x20))();
    while ((int)in_RDI[3] < local_5c) {
      if (0 < (int)in_RDI[3]) {
        memset((void *)in_RDI[2],0x20,(long)(int)in_RDI[3]);
      }
      local_5c = local_5c - (int)in_RDI[3];
      bVar1 = (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],&local_68,in_RDI + 3);
      *(byte *)((long)in_RDI + 0x1d) = (bVar1 ^ 0xff) & 1;
      if ((*(byte *)((long)in_RDI + 0x1d) & 1) != 0) {
        return;
      }
      in_RDI[2] = local_68;
    }
    memset((void *)in_RDI[2],0x20,(long)local_5c);
    in_RDI[2] = in_RDI[2] + (long)local_5c;
    *(int *)(in_RDI + 3) = (int)in_RDI[3] - local_5c;
  }
  return;
}

Assistant:

void WriteIndent() {
    if (indent_level_ == 0) {
      return;
    }
    GOOGLE_DCHECK(!failed_);
    int size = GetCurrentIndentationSize();

    while (size > buffer_size_) {
      // Data exceeds space in the buffer. Write what we can and request a new
      // buffer.
      if (buffer_size_ > 0) {
        memset(buffer_, ' ', buffer_size_);
      }
      size -= buffer_size_;
      void* void_buffer;
      failed_ = !output_->Next(&void_buffer, &buffer_size_);
      if (failed_) return;
      buffer_ = reinterpret_cast<char*>(void_buffer);
    }

    // Buffer is big enough to receive the data; copy it.
    memset(buffer_, ' ', size);
    buffer_ += size;
    buffer_size_ -= size;
  }